

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {

  return RUN_ALL_TESTS();
}